

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void when_button_cb(Fl_Light_Button *i,void *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Fl_Widget_Type *q;
  Fl_Type *pFVar4;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar3 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    Fl_Button::value(&i->super_Fl_Button,current_widget->o->when_ & 2);
    return;
  }
  cVar1 = (i->super_Fl_Button).value_;
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar2 = false;
    pFVar4 = Fl_Type::first;
    do {
      if (pFVar4->selected != '\0') {
        iVar3 = (*pFVar4->_vptr_Fl_Type[0x17])(pFVar4);
        if (iVar3 != 0) {
          *(byte *)((long)&(pFVar4[1].prev)->header_position + 3) =
               *(byte *)((long)&(pFVar4[1].prev)->header_position + 3) & 0xfd |
               (cVar1 != '\0') * '\x02';
          bVar2 = true;
        }
      }
      pFVar4 = pFVar4->next;
    } while (pFVar4 != (Fl_Type *)0x0);
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void when_button_cb(Fl_Light_Button* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    i->value(current_widget->o->when()&FL_WHEN_NOT_CHANGED);
  } else {
    int mod = 0;
    int n = i->value() ? FL_WHEN_NOT_CHANGED : 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->when(n|(q->o->when()&~FL_WHEN_NOT_CHANGED));
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}